

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

Matrix * lookat(Matrix *__return_storage_ptr__,Vec3f *eye,Vec3f *center,Vec3f *up)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  long lVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar7 = eye->x - center->x;
  fVar4 = eye->y - center->y;
  fVar9 = eye->z - center->z;
  fVar5 = fVar9 * fVar9 + fVar7 * fVar7 + fVar4 * fVar4;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  fVar9 = fVar9 * fVar5;
  fVar4 = fVar4 * fVar5;
  fVar7 = fVar7 * fVar5;
  fVar13 = up->y * fVar9 - fVar4 * up->z;
  fVar14 = up->z * fVar7 - fVar9 * up->x;
  fVar12 = up->x * fVar4 - fVar7 * up->y;
  fVar5 = fVar12 * fVar12 + fVar13 * fVar13 + fVar14 * fVar14;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  fVar12 = fVar12 * fVar5;
  fVar14 = fVar14 * fVar5;
  fVar13 = fVar13 * fVar5;
  fVar15 = fVar4 * fVar12 - fVar14 * fVar9;
  fVar11 = fVar9 * fVar13 - fVar12 * fVar7;
  fVar10 = fVar7 * fVar14 - fVar13 * fVar4;
  fVar5 = fVar10 * fVar10 + fVar15 * fVar15 + fVar11 * fVar11;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  Matrix::identity(__return_storage_ptr__,4);
  lVar3 = 0;
  do {
    pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
    fVar6 = fVar14;
    if (lVar3 != 1) {
      fVar6 = fVar12;
    }
    fVar8 = fVar13;
    if (lVar3 != 0) {
      fVar8 = fVar6;
    }
    (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = fVar8;
    pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
    fVar6 = fVar11;
    if (lVar3 != 1) {
      fVar6 = fVar10;
    }
    fVar8 = fVar15;
    if (lVar3 != 0) {
      fVar8 = fVar6;
    }
    (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = fVar8 * (1.0 / fVar5);
    pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
    fVar6 = fVar4;
    if (lVar3 != 1) {
      fVar6 = fVar9;
    }
    fVar8 = fVar7;
    if (lVar3 != 0) {
      fVar8 = fVar6;
    }
    (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = fVar8;
    lVar2 = (ulong)(lVar3 != 1) * 4 + 4;
    if (lVar3 == 0) {
      lVar2 = 0;
    }
    fVar6 = *(float *)((long)&center->x + lVar2);
    pvVar1 = Matrix::operator[](__return_storage_ptr__,(int)lVar3);
    (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[3] = -fVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix lookat(Vec3f eye, Vec3f center, Vec3f up) {
    Vec3f z = (eye-center).normalize();
    Vec3f x = (up^z).normalize();
    Vec3f y = (z^x).normalize();
    Matrix ret = Matrix::identity(4);
    for (int i=0; i<3; i++) {
        ret[0][i] = x[i];
        ret[1][i] = y[i];
        ret[2][i] = z[i];
        ret[i][3] = -center[i];
    }
    return ret;
}